

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilsTests.cpp
# Opt level: O1

int testSpecDowngradePipeline(void)

{
  pointer pcVar1;
  int iVar2;
  TypeUnion TVar3;
  Pipeline *pPVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ImageFeatureType *pIVar8;
  StringFeatureType *pSVar9;
  Type *pTVar10;
  ArrayFeatureType *pAVar11;
  VisionFeaturePrint *pVVar12;
  VisionFeaturePrint_Scene *this;
  GLMClassifier *pGVar13;
  Type *pTVar14;
  StringVector *pSVar15;
  Model *pMVar16;
  LogMessage *pLVar17;
  PipelineClassifier *pPVar18;
  ostream *poVar19;
  RepeatedPtrField<CoreML::Specification::Model> *this_00;
  int iVar20;
  Model spec;
  Model model;
  LogFinisher local_e9;
  undefined1 local_e8 [56];
  Model local_b0;
  Model local_80;
  LogMessage local_68;
  
  CoreML::Specification::Model::Model(&local_b0);
  local_b0.specificationversion_ = 7;
  if (local_b0._oneof_case_[0] != 200) {
    CoreML::Specification::Model::clear_Type(&local_b0);
    local_b0._oneof_case_[0] = 200;
    TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x20);
    CoreML::Specification::PipelineClassifier::PipelineClassifier(TVar3.pipelineclassifier_);
    local_b0.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
  }
  TVar3 = local_b0.Type_;
  if ((local_b0.Type_.pipelineclassifier_)->pipeline_ == (Pipeline *)0x0) {
    pPVar4 = (Pipeline *)operator_new(0x48);
    CoreML::Specification::Pipeline::Pipeline(pPVar4);
    (TVar3.pipelineclassifier_)->pipeline_ = pPVar4;
  }
  pPVar4 = (TVar3.pipelineclassifier_)->pipeline_;
  if (local_b0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_b0.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_b0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_e8 + 0x10;
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"image","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 4) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 4;
    pIVar8 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar8);
    (pFVar7->Type_).imagetype_ = pIVar8;
  }
  ((pFVar7->Type_).imagetype_)->width_ = 299;
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 4) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 4;
    pIVar8 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar8);
    (pFVar7->Type_).imagetype_ = pIVar8;
  }
  ((pFVar7->Type_).imagetype_)->height_ = 299;
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 4) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 4;
    pIVar8 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar8);
    (pFVar7->Type_).imagetype_ = pIVar8;
  }
  ((pFVar7->Type_).imagetype_)->colorspace_ = 0x1e;
  if (local_b0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_b0.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_b0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"classLabel","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 3;
    pSVar9 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar9);
    (pFVar7->Type_).stringtype_ = pSVar9;
  }
  if (local_b0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_b0.description_ = pMVar5;
  }
  pMVar5 = local_b0.description_;
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"classLabel","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar5->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  this_00 = &pPVar4->models_;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                      (&this_00->super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar10->specificationversion_ = 7;
  if (pTVar10->description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    pTVar10->description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pTVar10->description_->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"image","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 4) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 4;
    pIVar8 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar8);
    (pFVar7->Type_).imagetype_ = pIVar8;
  }
  ((pFVar7->Type_).imagetype_)->width_ = 299;
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 4) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 4;
    pIVar8 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar8);
    (pFVar7->Type_).imagetype_ = pIVar8;
  }
  ((pFVar7->Type_).imagetype_)->height_ = 299;
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 4) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 4;
    pIVar8 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar8);
    (pFVar7->Type_).imagetype_ = pIVar8;
  }
  ((pFVar7->Type_).imagetype_)->colorspace_ = 0x1e;
  if (pTVar10->description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    pTVar10->description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pTVar10->description_->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"features","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar7->Type_).multiarraytype_ = pAVar11;
  }
  ((pFVar7->Type_).multiarraytype_)->datatype_ = 0x10020;
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar7->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar7->Type_).multiarraytype_;
  iVar20 = (pAVar11->shape_).total_size_;
  if ((pAVar11->shape_).current_size_ == iVar20) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar20 + 1);
  }
  iVar20 = (pAVar11->shape_).current_size_;
  (pAVar11->shape_).current_size_ = iVar20 + 1;
  ((pAVar11->shape_).rep_)->elements[iVar20] = 0x800;
  if (pTVar10->_oneof_case_[0] != 0x7d2) {
    CoreML::Specification::Model::clear_Type(pTVar10);
    pTVar10->_oneof_case_[0] = 0x7d2;
    pVVar12 = (VisionFeaturePrint *)operator_new(0x20);
    CoreML::Specification::CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(pVVar12);
    (pTVar10->Type_).visionfeatureprint_ = pVVar12;
  }
  pVVar12 = (pTVar10->Type_).visionfeatureprint_;
  if (pVVar12->_oneof_case_[0] != 0x14) {
    CoreML::Specification::CoreMLModels::VisionFeaturePrint::clear_VisionFeaturePrintType(pVVar12);
    pVVar12->_oneof_case_[0] = 0x14;
    this = (VisionFeaturePrint_Scene *)operator_new(0x18);
    CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::VisionFeaturePrint_Scene(this);
    (pVVar12->VisionFeaturePrintType_).scene_ = this;
  }
  ((pVVar12->VisionFeaturePrintType_).scene_)->version_ = 1;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                      (&this_00->super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar10->specificationversion_ = 7;
  if (pTVar10->description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    pTVar10->description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pTVar10->description_->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"features","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar7->Type_).multiarraytype_ = pAVar11;
  }
  ((pFVar7->Type_).multiarraytype_)->datatype_ = 0x10020;
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar7->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar7->Type_).multiarraytype_;
  iVar20 = (pAVar11->shape_).total_size_;
  if ((pAVar11->shape_).current_size_ == iVar20) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar20 + 1);
  }
  iVar20 = (pAVar11->shape_).current_size_;
  (pAVar11->shape_).current_size_ = iVar20 + 1;
  ((pAVar11->shape_).rep_)->elements[iVar20] = 0x800;
  if (pTVar10->description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    pTVar10->description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pTVar10->description_->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"classLabel","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 3;
    pSVar9 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar9);
    (pFVar7->Type_).stringtype_ = pSVar9;
  }
  if (pTVar10->description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    pTVar10->description_ = pMVar5;
  }
  pMVar5 = pTVar10->description_;
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"classLabel","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar5->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar10->_oneof_case_[0] != 400) {
    CoreML::Specification::Model::clear_Type(pTVar10);
    pTVar10->_oneof_case_[0] = 400;
    pGVar13 = (GLMClassifier *)operator_new(0x58);
    CoreML::Specification::GLMClassifier::GLMClassifier(pGVar13);
    (pTVar10->Type_).glmclassifier_ = pGVar13;
  }
  pGVar13 = (pTVar10->Type_).glmclassifier_;
  pGVar13->postevaluationtransform_ = 0;
  iVar20 = (pGVar13->offset_).total_size_;
  if ((pGVar13->offset_).current_size_ == iVar20) {
    google::protobuf::RepeatedField<double>::Reserve(&pGVar13->offset_,iVar20 + 1);
  }
  iVar20 = (pGVar13->offset_).current_size_;
  (pGVar13->offset_).current_size_ = iVar20 + 1;
  ((pGVar13->offset_).rep_)->elements[iVar20] = 0.0;
  pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                      (&(pGVar13->weights_).super_RepeatedPtrFieldBase,(Type *)0x0);
  iVar20 = 0x800;
  do {
    iVar2 = (pTVar14->value_).total_size_;
    if ((pTVar14->value_).current_size_ == iVar2) {
      google::protobuf::RepeatedField<double>::Reserve(&pTVar14->value_,iVar2 + 1);
    }
    iVar2 = (pTVar14->value_).current_size_;
    (pTVar14->value_).current_size_ = iVar2 + 1;
    ((pTVar14->value_).rep_)->elements[iVar2] = 0.0;
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  if (pGVar13->_oneof_case_[0] != 100) {
    CoreML::Specification::GLMClassifier::clear_ClassLabels(pGVar13);
    pGVar13->_oneof_case_[0] = 100;
    pSVar15 = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(pSVar15);
    (pGVar13->ClassLabels_).stringclasslabels_ = pSVar15;
  }
  CoreML::Specification::StringVector::add_vector((pGVar13->ClassLabels_).stringclasslabels_,"cat");
  if (pGVar13->_oneof_case_[0] != 100) {
    CoreML::Specification::GLMClassifier::clear_ClassLabels(pGVar13);
    pGVar13->_oneof_case_[0] = 100;
    pSVar15 = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(pSVar15);
    (pGVar13->ClassLabels_).stringclasslabels_ = pSVar15;
  }
  CoreML::Specification::StringVector::add_vector((pGVar13->ClassLabels_).stringclasslabels_,"dog");
  CoreML::Model::Model(&local_80,&local_b0);
  pMVar16 = CoreML::Model::getProto(&local_80);
  if (pMVar16->specificationversion_ == 3) {
    pMVar16 = CoreML::Model::getProto(&local_80);
    if (pMVar16->_oneof_case_[0] == 200) {
      pPVar18 = (pMVar16->Type_).pipelineclassifier_;
    }
    else {
      pPVar18 = CoreML::Specification::PipelineClassifier::default_instance();
    }
    pPVar4 = pPVar18->pipeline_;
    if (pPVar4 == (Pipeline *)0x0) {
      pPVar4 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
    }
    if ((pPVar4->models_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar17 = google::protobuf::internal::LogMessage::operator<<
                          (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_e8,pLVar17);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)((long)((pPVar4->models_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18) == 3
       ) {
      pMVar16 = CoreML::Model::getProto(&local_80);
      if (pMVar16->_oneof_case_[0] == 200) {
        pPVar18 = (pMVar16->Type_).pipelineclassifier_;
      }
      else {
        pPVar18 = CoreML::Specification::PipelineClassifier::default_instance();
      }
      pPVar4 = pPVar18->pipeline_;
      if (pPVar4 == (Pipeline *)0x0) {
        pPVar4 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
      }
      if ((pPVar4->models_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5c6);
        pLVar17 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_e9,pLVar17);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
      }
      iVar20 = 0;
      if (*(int *)(*(long *)((pPVar4->models_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18) == 1)
      goto LAB_001c57e8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,
                 "(model.getProto().pipelineclassifier().pipeline().models(1).specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS11)"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,
                 "(model.getProto().pipelineclassifier().pipeline().models(0).specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS12)"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UtilsTests.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x49);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,
               "(model.getProto().specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS12)",
               0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  }
  std::ostream::put((char)poVar19);
  iVar20 = 1;
  std::ostream::flush();
LAB_001c57e8:
  CoreML::Model::~Model(&local_80);
  CoreML::Specification::Model::~Model(&local_b0);
  return iVar20;
}

Assistant:

int testSpecDowngradePipeline() {

    int32_t latestVersion = MLMODEL_SPECIFICATION_VERSION;

    Specification::Model spec;
    spec.set_specificationversion(latestVersion);
    auto* pipeline = spec.mutable_pipelineclassifier()->mutable_pipeline();

    auto* input = spec.mutable_description()->add_input();
    input->set_name("image");
    input->mutable_type()->mutable_imagetype()->set_width(299);
    input->mutable_type()->mutable_imagetype()->set_height(299);
    input->mutable_type()->mutable_imagetype()->set_colorspace(Specification::ImageFeatureType_ColorSpace_BGR);

    auto* output = spec.mutable_description()->add_output();
    output->set_name("classLabel");
    output->mutable_type()->mutable_stringtype();

    spec.mutable_description()->set_predictedfeaturename("classLabel");

    // VisionFeaturePrint
    auto *featureModel = pipeline->add_models();
    featureModel->set_specificationversion(latestVersion);

    auto* featureInput = featureModel->mutable_description()->add_input();
    featureInput->set_name("image");
    featureInput->mutable_type()->mutable_imagetype()->set_width(299);
    featureInput->mutable_type()->mutable_imagetype()->set_height(299);
    featureInput->mutable_type()->mutable_imagetype()->set_colorspace(Specification::ImageFeatureType_ColorSpace_BGR);

    auto featureOutput = featureModel->mutable_description()->add_output();
    featureOutput->set_name("features");
    featureOutput->mutable_type()->mutable_multiarraytype()->set_datatype(Specification::ArrayFeatureType::FLOAT32);
    featureOutput->mutable_type()->mutable_multiarraytype()->add_shape(2048);


    featureModel->mutable_visionfeatureprint()->mutable_scene()->set_version(Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);

    // Logistic regression
    auto *classifierModel = pipeline->add_models();
    classifierModel->set_specificationversion(latestVersion);

    auto classifierInput = classifierModel->mutable_description()->add_input();
    classifierInput->set_name("features");
    classifierInput->mutable_type()->mutable_multiarraytype()->set_datatype(Specification::ArrayFeatureType::FLOAT32);
    classifierInput->mutable_type()->mutable_multiarraytype()->add_shape(2048);

    auto classifierOutput = classifierModel->mutable_description()->add_output();
    classifierOutput->set_name("classLabel");
    classifierOutput->mutable_type()->mutable_stringtype();
    classifierModel->mutable_description()->set_predictedfeaturename("classLabel");

    auto glm = classifierModel->mutable_glmclassifier();
    glm->set_postevaluationtransform(::CoreML::Specification::GLMClassifier_PostEvaluationTransform_Logit);
    glm->add_offset(0.0);
    auto weights = glm->add_weights();
    for (int i=0; i<2048; i++) { weights->add_value(0.0); }
    glm->mutable_stringclasslabels()->add_vector("cat");
    glm->mutable_stringclasslabels()->add_vector("dog");

    // Constructing an CoreML::Model should downgrade spec on load
    Model model(spec);

    // Top level should be IOS 12 because it contains vision feature print
    ML_ASSERT_EQ(model.getProto().specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS12);

    // First model in pipeline is vision feature print and should have IOS12 spec version
    ML_ASSERT_EQ(model.getProto().pipelineclassifier().pipeline().models(0).specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS12);

    // Second model is just a GLM which has support in IOS 11
    ML_ASSERT_EQ(model.getProto().pipelineclassifier().pipeline().models(1).specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS11);

    return 0;
}